

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::PrepareForIndexedDraw
          (DeviceContextVkImpl *this,DRAW_FLAGS Flags,VALUE_TYPE IndexType)

{
  Uint64 UVar1;
  VkIndexType IndexType_00;
  VkBuffer Buffer;
  size_t sVar2;
  string msg;
  
  PrepareForDraw(this,Flags);
  if ((Flags & DRAW_FLAG_VERIFY_STATES) != DRAW_FLAG_NONE) {
    DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyBufferState
              ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,
               (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pIndexBuffer.m_pObject,
               RESOURCE_STATE_INDEX_BUFFER,"Indexed draw call (DeviceContextVkImpl::Draw)");
  }
  if (1 < (byte)(IndexType - VT_UINT16)) {
    FormatString<char[66]>
              (&msg,(char (*) [66])
                    "Unsupported index format. Only R16_UINT and R32_UINT are allowed.");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PrepareForIndexedDraw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x332);
    std::__cxx11::string::~string((string *)&msg);
  }
  IndexType_00 = TypeToVkIndexType(IndexType);
  Buffer = BufferVkImpl::GetVkBuffer
                     ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pIndexBuffer.m_pObject
                     );
  UVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_IndexDataStartOffset;
  sVar2 = GetDynamicBufferOffset
                    (this,(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pIndexBuffer.
                          m_pObject,true);
  VulkanUtilities::VulkanCommandBuffer::BindIndexBuffer
            (&this->m_CommandBuffer,Buffer,UVar1 + sVar2,IndexType_00);
  return;
}

Assistant:

void DeviceContextVkImpl::PrepareForIndexedDraw(DRAW_FLAGS Flags, VALUE_TYPE IndexType)
{
    PrepareForDraw(Flags);

#ifdef DILIGENT_DEVELOPMENT
    if ((Flags & DRAW_FLAG_VERIFY_STATES) != 0)
    {
        DvpVerifyBufferState(*m_pIndexBuffer, RESOURCE_STATE_INDEX_BUFFER, "Indexed draw call (DeviceContextVkImpl::Draw)");
    }
#endif
    DEV_CHECK_ERR(IndexType == VT_UINT16 || IndexType == VT_UINT32, "Unsupported index format. Only R16_UINT and R32_UINT are allowed.");
    VkIndexType vkIndexType = TypeToVkIndexType(IndexType);
    m_CommandBuffer.BindIndexBuffer(m_pIndexBuffer->GetVkBuffer(), m_IndexDataStartOffset + GetDynamicBufferOffset(m_pIndexBuffer), vkIndexType);
}